

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlFatalErrMsgStr(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *val)

{
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,1,error,XML_ERR_FATAL,(char *)0x0,0,(char *)val,(char *)0x0,
                    (char *)0x0,0,0,msg,val);
  }
  else if ((ctxt->disableSAX == 0) || (ctxt->instate != XML_PARSER_EOF)) {
    ctxt->errNo = error;
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,
                    (void *)0x0,1,error,XML_ERR_FATAL,(char *)0x0,0,(char *)val,(char *)0x0,
                    (char *)0x0,0,0,msg,val);
    ctxt->wellFormed = 0;
    if (ctxt->recovery == 0) {
      ctxt->disableSAX = 1;
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlFatalErrMsgStr(xmlParserCtxtPtr ctxt, xmlParserErrors error,
                  const char *msg, const xmlChar * val)
{
    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL)
	ctxt->errNo = error;
    __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL,
                    XML_FROM_PARSER, error, XML_ERR_FATAL,
                    NULL, 0, (const char *) val, NULL, NULL, 0, 0, msg,
                    val);
    if (ctxt != NULL) {
	ctxt->wellFormed = 0;
	if (ctxt->recovery == 0)
	    ctxt->disableSAX = 1;
    }